

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::SetVariableResponse>::copyConstruct
          (BasicTypeInfo<dap::SetVariableResponse> *this,void *dst,void *src)

{
  *(undefined8 *)dst = *src;
  *(undefined1 *)((long)dst + 8) = *(undefined1 *)((long)src + 8);
  *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)((long)src + 0x10);
  *(undefined1 *)((long)dst + 0x18) = *(undefined1 *)((long)src + 0x18);
  *(long *)((long)dst + 0x20) = (long)dst + 0x30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x20),*(long *)((long)src + 0x20),
             *(long *)((long)src + 0x28) + *(long *)((long)src + 0x20));
  *(undefined1 *)((long)dst + 0x40) = *(undefined1 *)((long)src + 0x40);
  *(long *)((long)dst + 0x48) = (long)dst + 0x58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x48),*(long *)((long)src + 0x48),
             *(long *)((long)src + 0x50) + *(long *)((long)src + 0x48));
  *(undefined8 *)((long)dst + 0x68) = *(undefined8 *)((long)src + 0x68);
  *(undefined1 *)((long)dst + 0x70) = *(undefined1 *)((long)src + 0x70);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }